

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3<pbrt::Interval<float>_> * __thiscall
pbrt::Tuple3<pbrt::Vector3,pbrt::Interval<float>>::operator*
          (Vector3<pbrt::Interval<float>_> *__return_storage_ptr__,
          Tuple3<pbrt::Vector3,pbrt::Interval<float>> *this,Interval<float> s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Interval<float> IVar3;
  Interval<float> IVar4;
  undefined8 extraout_XMM0_Qb;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar6 [64];
  Interval<float> local_20;
  undefined1 extraout_var [56];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = s;
  local_20 = (Interval<float>)vmovlps_avx(auVar5._0_16_);
  IVar3 = Interval<float>::operator*<float>(&local_20,*(Interval<float> *)this);
  IVar4 = Interval<float>::operator*<float>(&local_20,*(Interval<float> *)(this + 8));
  auVar6._0_8_ = Interval<float>::operator*<float>(&local_20,*(Interval<float> *)(this + 0x10));
  auVar6._8_56_ = extraout_var;
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_4_ = IVar3.low;
  auVar2._4_4_ = IVar3.high;
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_4_ = IVar4.low;
  auVar1._4_4_ = IVar4.high;
  auVar1 = vunpcklpd_avx(auVar2,auVar1);
  (__return_storage_ptr__->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).x.low =
       (float)(int)auVar1._0_8_;
  (__return_storage_ptr__->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).x.high =
       (float)(int)((ulong)auVar1._0_8_ >> 0x20);
  (__return_storage_ptr__->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).y.low =
       (float)(int)auVar1._8_8_;
  (__return_storage_ptr__->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).y.high =
       (float)(int)((ulong)auVar1._8_8_ >> 0x20);
  IVar3 = (Interval<float>)vmovlps_avx(auVar6._0_16_);
  (__return_storage_ptr__->super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>).z = IVar3;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU auto operator*(U s) const -> Child<decltype(T{} * U{})> {
        return {s * x, s * y, s * z};
    }